

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O0

void pdf_drop_xref_sections_imp
               (hd_context *ctx,pdf_document *doc,pdf_xref *xref_sections,int num_xref_sections)

{
  pdf_xref_subsec *ppVar1;
  pdf_xref_entry *ppVar2;
  pdf_unsaved_sig *p;
  pdf_xref_entry *entry;
  pdf_xref_subsec *next_sub;
  pdf_xref_subsec *sub;
  pdf_xref *xref;
  int e;
  int x;
  pdf_unsaved_sig *usig;
  int num_xref_sections_local;
  pdf_xref *xref_sections_local;
  pdf_document *doc_local;
  hd_context *ctx_local;
  
  for (xref._4_4_ = 0; xref._4_4_ < num_xref_sections; xref._4_4_ = xref._4_4_ + 1) {
    next_sub = xref_sections[xref._4_4_].subsec;
    while (next_sub != (pdf_xref_subsec *)0x0) {
      ppVar1 = next_sub->next;
      for (xref._0_4_ = 0; (int)xref < next_sub->len; xref._0_4_ = (int)xref + 1) {
        ppVar2 = next_sub->table;
        if (ppVar2[(int)xref].obj != (pdf_obj *)0x0) {
          pdf_drop_obj(ctx,ppVar2[(int)xref].obj);
          hd_drop_buffer(ctx,ppVar2[(int)xref].stm_buf);
        }
      }
      hd_free(ctx,next_sub->table);
      hd_free(ctx,next_sub);
      next_sub = ppVar1;
    }
    pdf_drop_obj(ctx,xref_sections[xref._4_4_].pre_repair_trailer);
    pdf_drop_obj(ctx,xref_sections[xref._4_4_].trailer);
    while (p = xref_sections[xref._4_4_].unsaved_sigs, p != (pdf_unsaved_sig *)0x0) {
      xref_sections[xref._4_4_].unsaved_sigs = p->next;
      pdf_drop_obj(ctx,p->field);
      hd_free(ctx,p);
    }
  }
  hd_free(ctx,xref_sections);
  return;
}

Assistant:

static void pdf_drop_xref_sections_imp(hd_context *ctx, pdf_document *doc, pdf_xref *xref_sections, int num_xref_sections)
{
    pdf_unsaved_sig *usig;
    int x, e;

    for (x = 0; x < num_xref_sections; x++)
    {
        pdf_xref *xref = &xref_sections[x];
        pdf_xref_subsec *sub = xref->subsec;

        while (sub != NULL)
        {
            pdf_xref_subsec *next_sub = sub->next;
            for (e = 0; e < sub->len; e++)
            {
                pdf_xref_entry *entry = &sub->table[e];

                if (entry->obj)
                {
                    pdf_drop_obj(ctx, entry->obj);
                    hd_drop_buffer(ctx, entry->stm_buf);
                }
            }
            hd_free(ctx, sub->table);
            hd_free(ctx, sub);
            sub = next_sub;
        }

        pdf_drop_obj(ctx, xref->pre_repair_trailer);
        pdf_drop_obj(ctx, xref->trailer);

        while ((usig = xref->unsaved_sigs) != NULL)
        {
            xref->unsaved_sigs = usig->next;
            pdf_drop_obj(ctx, usig->field);
            hd_free(ctx, usig);
        }
    }

    hd_free(ctx, xref_sections);
}